

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memtable.cc
# Opt level: O3

void __thiscall
leveldb::MemTable::Add(MemTable *this,SequenceNumber s,ValueType type,Slice *key,Slice *value)

{
  size_t __n;
  uint64_t v;
  ulong uVar1;
  int iVar2;
  int iVar3;
  ValueType VVar4;
  char *dst;
  char *__dest;
  char *pcVar5;
  ulong bytes;
  char *buf;
  char *local_38;
  
  __n = key->size_;
  v = value->size_;
  iVar2 = VarintLength(__n + 8);
  iVar3 = VarintLength(v);
  bytes = v + __n + 8 + (long)iVar2 + (long)iVar3;
  if (bytes == 0) {
    __assert_fail("bytes > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/./util/arena.h"
                  ,0x3b,"char *leveldb::Arena::Allocate(size_t)");
  }
  uVar1 = (this->arena_).alloc_bytes_remaining_;
  if (uVar1 < bytes) {
    dst = Arena::AllocateFallback(&this->arena_,bytes);
  }
  else {
    dst = (this->arena_).alloc_ptr_;
    (this->arena_).alloc_ptr_ = dst + bytes;
    (this->arena_).alloc_bytes_remaining_ = uVar1 - bytes;
  }
  local_38 = dst;
  __dest = EncodeVarint32(dst,(uint32_t)(__n + 8));
  memcpy(__dest,key->data_,__n);
  VVar4 = (int)s << 8 | type;
  pcVar5 = __dest + __n;
  *pcVar5 = (char)type;
  __dest[__n + 1] = (char)(VVar4 >> 8);
  pcVar5[2] = (char)(VVar4 >> 0x10);
  pcVar5[3] = (char)(VVar4 >> 0x18);
  pcVar5[4] = (char)(s >> 0x18);
  pcVar5[5] = (char)(s >> 0x20);
  pcVar5[6] = (char)(s >> 0x28);
  pcVar5[7] = (char)(s >> 0x30);
  pcVar5 = EncodeVarint32(pcVar5 + 8,(uint32_t)v);
  memcpy(pcVar5,value->data_,v);
  if (pcVar5 + v == dst + bytes) {
    SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::Insert(&this->table_,&local_38);
    return;
  }
  __assert_fail("p + val_size == buf + encoded_len",
                "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/memtable.cc"
                ,0x61,
                "void leveldb::MemTable::Add(SequenceNumber, ValueType, const Slice &, const Slice &)"
               );
}

Assistant:

void MemTable::Add(SequenceNumber s, ValueType type, const Slice& key,
                   const Slice& value) {
  // Format of an entry is concatenation of:
  //  key_size     : varint32 of internal_key.size()
  //  key bytes    : char[internal_key.size()]
  //  value_size   : varint32 of value.size()
  //  value bytes  : char[value.size()]
  size_t key_size = key.size();
  size_t val_size = value.size();
  size_t internal_key_size = key_size + 8;
  const size_t encoded_len = VarintLength(internal_key_size) +
                             internal_key_size + VarintLength(val_size) +
                             val_size;
  char* buf = arena_.Allocate(encoded_len);
  char* p = EncodeVarint32(buf, internal_key_size);
  std::memcpy(p, key.data(), key_size);
  p += key_size;
  EncodeFixed64(p, (s << 8) | type);
  p += 8;
  p = EncodeVarint32(p, val_size);
  std::memcpy(p, value.data(), val_size);
  assert(p + val_size == buf + encoded_len);
  table_.Insert(buf);
}